

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::make_uniq_base<duckdb::LogicalOperator,duckdb::LogicalDummyScan,unsigned_long&>
          (duckdb *this,unsigned_long *args)

{
  _func_int **pp_Var1;
  LogicalOperator *this_00;
  
  this_00 = (LogicalOperator *)operator_new(0x70);
  pp_Var1 = (_func_int **)*args;
  LogicalOperator::LogicalOperator(this_00,LOGICAL_DUMMY_SCAN);
  this_00->_vptr_LogicalOperator = (_func_int **)&PTR__LogicalOperator_02470548;
  this_00[1]._vptr_LogicalOperator = pp_Var1;
  *(LogicalOperator **)this = this_00;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}